

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O3

FilterTypes helics::filterTypeFromString(string_view filterType)

{
  long *plVar1;
  size_t sVar2;
  int iVar3;
  const_iterator cVar4;
  FilterTypes FVar5;
  char *in_RSI;
  size_t in_RDI;
  size_t sVar6;
  string nfilt;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  key_type local_48;
  key_type local_38;
  
  local_48._M_len = in_RDI;
  local_48._M_str = in_RSI;
  cVar4 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>_>_>
          ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>_>_>
                  *)filterTypes,&local_48);
  if (cVar4._M_node == (_Base_ptr)(filterTypes + 8)) {
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,local_48._M_str,local_48._M_str + local_48._M_len);
    sVar2 = local_60;
    plVar1 = local_68;
    if (local_60 == 0) {
      local_60 = 0;
    }
    else {
      sVar6 = 0;
      do {
        iVar3 = tolower((int)*(char *)((long)plVar1 + sVar6));
        *(char *)((long)plVar1 + sVar6) = (char)iVar3;
        sVar6 = sVar6 + 1;
      } while (sVar2 != sVar6);
    }
    local_38._M_str = (char *)local_68;
    local_38._M_len = local_60;
    cVar4 = std::
            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>_>_>
            ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::FilterTypes>_>_>
                    *)filterTypes,&local_38);
    if (cVar4._M_node == (_Base_ptr)(filterTypes + 8)) {
      FVar5 = UNRECOGNIZED;
    }
    else {
      FVar5 = *(FilterTypes *)&cVar4._M_node[1]._M_left;
    }
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
  }
  else {
    FVar5 = *(FilterTypes *)&cVar4._M_node[1]._M_left;
  }
  return FVar5;
}

Assistant:

FilterTypes filterTypeFromString(std::string_view filterType) noexcept
{
    auto fnd = filterTypes.find(filterType);
    if (fnd != filterTypes.end()) {
        return fnd->second;
    }
    std::string nfilt{filterType};
    std::transform(nfilt.begin(), nfilt.end(), nfilt.begin(), ::tolower);
    fnd = filterTypes.find(nfilt);
    if (fnd != filterTypes.end()) {
        return fnd->second;
    }
    return FilterTypes::UNRECOGNIZED;
}